

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O1

DecodeStatus decodeBDAddr12Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  DecodeStatus extraout_EAX;
  uint Reg;
  
  Reg = 0;
  if (0xfff < Field) {
    Reg = Regs[Field >> 0xc];
  }
  MCOperand_CreateReg0(Inst,Reg);
  MCOperand_CreateImm0(Inst,(ulong)((uint)Field & 0xfff));
  return extraout_EAX;
}

Assistant:

static DecodeStatus decodeBDAddr12Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Base = Field >> 12;
	uint64_t Disp = Field & 0xfff;
	//assert(Base < 16 && "Invalid BDAddr12");

	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, Disp);

	return MCDisassembler_Success;
}